

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O3

ParameterInfo * __thiscall
C3DFile::readParameterInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,ifstream *datastream)

{
  Sint8 *pSVar1;
  Uint8 *pUVar2;
  byte bVar3;
  char cVar4;
  char *pcVar5;
  Uint8 *pUVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  __return_storage_ptr__->name_length = -1;
  __return_storage_ptr__->group_id = -1;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->next_offset = -1;
  __return_storage_ptr__->data_type = -1;
  __return_storage_ptr__->n_dimensions = 0xff;
  __return_storage_ptr__->dimensions = (Uint8 *)0x0;
  __return_storage_ptr__->char_data = (char *)0x0;
  __return_storage_ptr__->int_data = (Sint16 *)0x0;
  __return_storage_ptr__->float_data = (float *)0x0;
  __return_storage_ptr__->descr_length = -1;
  __return_storage_ptr__->description = (char *)0x0;
  __return_storage_ptr__->locked = false;
  std::istream::read((char *)datastream,(long)__return_storage_ptr__);
  if (__return_storage_ptr__->name != (char *)0x0) {
    __assert_fail("result.name == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xdc,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  cVar4 = __return_storage_ptr__->name_length;
  bVar11 = cVar4 < '\0';
  if (bVar11) {
    cVar4 = -cVar4;
    __return_storage_ptr__->name_length = cVar4;
  }
  __return_storage_ptr__->locked = bVar11;
  pcVar5 = (char *)operator_new__((long)cVar4 + 1);
  __return_storage_ptr__->name = pcVar5;
  std::istream::read((char *)datastream,(long)pcVar5);
  __return_storage_ptr__->name[__return_storage_ptr__->name_length] = '\0';
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->next_offset);
  pSVar1 = &__return_storage_ptr__->data_type;
  std::istream::read((char *)datastream,(long)pSVar1);
  pUVar2 = &__return_storage_ptr__->n_dimensions;
  std::istream::read((char *)datastream,(long)pUVar2);
  uVar9 = (ulong)*pUVar2;
  if (7 < uVar9) {
    __assert_fail("result.n_dimensions <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xed,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pUVar6 = (Uint8 *)operator_new__(uVar9);
  __return_storage_ptr__->dimensions = pUVar6;
  if (uVar9 == 0) {
    bVar3 = *pSVar1;
    if (bVar3 < 4) {
      if (bVar3 == 1) {
LAB_001081f9:
        pvVar7 = operator_new__(1);
        lVar8 = 0x20;
      }
      else {
        if (bVar3 != 2) goto LAB_0010825f;
        pvVar7 = operator_new__(2);
        lVar8 = 0x28;
      }
    }
    else {
      if (bVar3 != 4) {
        if (bVar3 != 0xff) goto LAB_0010825f;
        goto LAB_001081f9;
      }
      pvVar7 = operator_new__(4);
      lVar8 = 0x30;
    }
    *(void **)(&__return_storage_ptr__->name_length + lVar8) = pvVar7;
    std::istream::read((char *)datastream,(long)pvVar7);
    goto LAB_0010825f;
  }
  uVar10 = 1;
  uVar9 = 0;
  do {
    std::istream::read((char *)datastream,(long)(pUVar6 + uVar9));
    pUVar6 = __return_storage_ptr__->dimensions;
    uVar10 = uVar10 * pUVar6[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar9 < *pUVar2);
  bVar3 = *pSVar1;
  if (bVar3 < 4) {
    if (bVar3 == 1) {
LAB_001081db:
      pvVar7 = operator_new__((ulong)uVar10);
      lVar8 = 0x20;
    }
    else {
      if (bVar3 != 2) goto LAB_0010825f;
      pvVar7 = operator_new__((ulong)(uVar10 * 2));
      lVar8 = 0x28;
    }
  }
  else {
    if (bVar3 != 4) {
      if (bVar3 != 0xff) goto LAB_0010825f;
      goto LAB_001081db;
    }
    pvVar7 = operator_new__((ulong)uVar10 << 2);
    lVar8 = 0x30;
  }
  *(void **)(&__return_storage_ptr__->name_length + lVar8) = pvVar7;
  std::istream::read((char *)datastream,(long)pvVar7);
LAB_0010825f:
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->descr_length);
  if (__return_storage_ptr__->description != (char *)0x0) {
    __assert_fail("result.description == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x117,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pcVar5 = (char *)operator_new__((long)__return_storage_ptr__->descr_length + 1);
  __return_storage_ptr__->description = pcVar5;
  std::istream::read((char *)datastream,(long)pcVar5);
  __return_storage_ptr__->description[__return_storage_ptr__->descr_length] = '\0';
  return __return_storage_ptr__;
}

Assistant:

ParameterInfo C3DFile::readParameterInfo (ifstream &datastream) {
	ParameterInfo result;
	datastream.read(reinterpret_cast<char *>(&result), sizeof(Sint8) * 2);
	
	assert(result.name == NULL);
	if (result.name_length < 0) {
		result.name_length *= -1;
		result.locked = true;
	} else {
		result.locked = false;
	}
	result.name = new char[result.name_length + 1];
	datastream.read(result.name, result.name_length);
	result.name[result.name_length] = 0;

	datastream.read(reinterpret_cast<char *>(&result.next_offset), sizeof(Sint16));
	datastream.read(reinterpret_cast<char *>(&result.data_type), sizeof(Uint8));
	datastream.read(reinterpret_cast<char *>(&result.n_dimensions), sizeof(Uint8));

	if (result.n_dimensions > 1) {
		// maximum of 7 dimensions (see c3d UG p. 50)
		assert (result.n_dimensions <= 7);
	}

	result.dimensions = new Uint8[result.n_dimensions];

	int i;

	if (result.n_dimensions == 0) {
		// if dim == 0 the data comes right away
		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[1];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char));
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[1];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16));
		} else if (result.data_type == 4) {
			result.float_data = new float[1];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float));
		}
	} else {
		// we first have to read out the dimensions of the values and then we can
		// store the values
		int count = 1;
		for (i = 0; i < result.n_dimensions; i++) {
			datastream.read(reinterpret_cast<char *>(&result.dimensions[i]), sizeof(Uint8));
			count *= result.dimensions[i];
		}

		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[count];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char) * count);
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[count];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16) * count);
		} else if (result.data_type == 4) {
			result.float_data = new float[count];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float) * count);
		}
	}

	datastream.read(reinterpret_cast<char *>(&result.descr_length), sizeof(Uint8));

	assert(result.description == NULL);
	result.description = new char[result.descr_length + 1];
	datastream.read(result.description, result.descr_length);
	result.description[result.descr_length] = 0;

	return result;
}